

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen_c_json_parser.c
# Opt level: O1

void gen_trie(fb_output_t *out,trie_t *trie,int a,int b,int pos)

{
  bool bVar1;
  trie_t *ptVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  char *format;
  fb_output_t *out_00;
  undefined4 in_register_00000084;
  dict_entry_t *pdVar7;
  uint label;
  long lVar8;
  long lVar9;
  int iVar10;
  bool bVar11;
  int len;
  char *name;
  uint64_t wg;
  uint64_t wf;
  uint64_t wmf;
  uint64_t tag;
  uint64_t mask;
  uint64_t wmg;
  uint local_bc;
  ulong local_b8;
  char *local_b0;
  int local_a4;
  undefined8 local_a0;
  trie_t *local_98;
  int local_8c;
  dict_entry_t *local_88;
  uint64_t local_80;
  uint64_t local_78;
  long local_70;
  uint64_t local_68;
  fb_output_t *local_60;
  uint64_t local_58 [3];
  ulong local_40;
  long local_38;
  
  local_a0 = CONCAT44(in_register_00000084,pos);
  local_b8 = (ulong)(uint)a;
  local_58[0] = 0;
  local_58[1] = 0;
  local_b0 = "";
  local_bc = 0;
  local_88 = trie->dict;
  local_70 = (long)a;
  local_38 = local_70 * 0x20;
  local_8c = pos + 8;
  if ((local_88[local_70].len < local_8c || local_88[local_70].len - pos == 8) &&
     ((b == a || ((a + 1 == b && (local_88[b].len < local_8c || local_88[b].len - pos == 8)))))) {
    gen_prefix_trie(out,trie,a,b,pos,0);
    return;
  }
  iVar5 = (b - a) / 2;
  iVar6 = iVar5 + a;
  local_78 = 0;
  local_80 = 0;
  local_68 = 0;
  local_58[2] = 0;
  lVar9 = (long)iVar6;
  iVar10 = iVar6;
  local_a4 = b;
  local_98 = trie;
  local_60 = out;
  if (1 < b - a) {
    local_40 = (ulong)(iVar6 - 1U);
    if (a < (int)(iVar6 - 1U)) {
      local_40 = (ulong)(uint)a;
    }
    pdVar7 = local_88 + lVar9;
    lVar8 = lVar9;
    do {
      get_dict_tag(pdVar7 + -1,pos,&local_78,&local_68,(char **)0x0,(int *)0x0);
      get_dict_tag(pdVar7,pos,&local_80,local_58 + 2,(char **)0x0,(int *)0x0);
      a = (int)local_b8;
      if ((local_68 & (local_80 ^ local_78)) != 0) {
        iVar10 = (int)lVar8;
        goto LAB_00114203;
      }
      lVar8 = lVar8 + -1;
      pdVar7 = pdVar7 + -1;
    } while (local_70 < lVar8);
    iVar10 = (int)local_40;
  }
LAB_00114203:
  iVar4 = (int)local_a0;
  if (a < iVar10) {
    get_dict_tag(local_88 + iVar10,iVar4,local_58,local_58 + 1,&local_b0,(int *)&local_bc);
    out_00 = local_60;
    println(local_60,"if (w < 0x%lx) { /* branch \"%.*s\" */",local_58[0],(ulong)local_bc,local_b0);
    ptVar2 = local_98;
    out_00->indent = out_00->indent + 1;
    gen_trie(out_00,local_98,a,iVar10 + -1,iVar4);
    if (out_00->indent == 0) {
      __assert_fail("out->indent",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                    ,0x402,"void gen_trie(fb_output_t *, trie_t *, int, int, int)");
    }
    out_00->indent = out_00->indent + -1;
    println(out_00,"} else { /* branch \"%.*s\" */",(ulong)local_bc,local_b0);
    out_00->indent = out_00->indent + 1;
    gen_trie(out_00,ptVar2,iVar10,local_a4,iVar4);
    if (out_00->indent == 0) {
      __assert_fail("out->indent",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                    ,0x404,"void gen_trie(fb_output_t *, trie_t *, int, int, int)");
    }
    out_00->indent = out_00->indent + -1;
    format = "} /* branch \"%.*s\" */";
  }
  else {
    local_78 = 0;
    local_80 = 0;
    local_68 = 0;
    local_58[2] = 0;
    if (iVar6 < local_a4) {
      iVar6 = local_a4;
    }
    iVar5 = -iVar5;
    lVar8 = iVar6 - lVar9;
    pdVar7 = local_88 + lVar9;
    do {
      bVar11 = lVar8 == 0;
      lVar8 = lVar8 + -1;
      if (bVar11) {
        iVar10 = (int)local_b8;
        iVar5 = (iVar10 - iVar5) + 1;
        goto LAB_001143b1;
      }
      get_dict_tag(pdVar7,iVar4,&local_78,&local_68,(char **)0x0,(int *)0x0);
      pdVar7 = pdVar7 + 1;
      get_dict_tag(pdVar7,iVar4,&local_80,local_58 + 2,(char **)0x0,(int *)0x0);
      iVar5 = iVar5 + -1;
    } while ((local_68 & (local_80 ^ local_78)) == 0);
    iVar10 = (int)local_b8;
    iVar5 = iVar10 - iVar5;
LAB_001143b1:
    iVar4 = (int)local_a0;
    iVar6 = iVar10;
    if (iVar10 < iVar5) {
      piVar3 = (int *)((long)&local_88->len + local_38);
      do {
        if ((local_8c <= *piVar3) && (iVar6 = iVar10, 0 < (*piVar3 - iVar4) + -8)) break;
        iVar10 = iVar10 + 1;
        piVar3 = piVar3 + 8;
        iVar6 = iVar5;
      } while (iVar5 != iVar10);
    }
    out_00 = local_60;
    iVar10 = iVar6;
    if (iVar6 < iVar5) {
      if ((int)local_b8 < iVar6) {
        bVar11 = local_88[(long)iVar6 + -1].len - iVar4 == 8 &&
                 local_88[(long)iVar6 + -1].len <= local_8c;
      }
      else {
        bVar11 = false;
      }
      local_70 = CONCAT44(local_70._4_4_,iVar5 + -1);
      get_dict_tag(local_88 + iVar6,iVar4,local_58,local_58 + 1,&local_b0,(int *)&local_bc);
      out_00 = local_60;
      println(local_60,"if (w == 0x%lx) { /* descend \"%.*s\" */",local_58[0],(ulong)local_bc,
              local_b0);
      out_00->indent = out_00->indent + 1;
      if (bVar11) {
        println(out_00,"/* descend prefix key \"%.*s\" */",(ulong)local_bc,local_b0);
        ptVar2 = local_98;
        (*local_98->gen_match)
                  (out_00,local_98->ct,local_98->dict[(long)iVar6 + -1].data,
                   local_98->dict[(long)iVar6 + -1].hint,8);
        println(out_00,"/* descend suffix \"%.*s\" */",(ulong)local_bc,local_b0);
        println(out_00,"buf += 8;");
        println(out_00,"w = flatcc_json_parser_symbol_part(buf, end);");
        gen_trie(out_00,ptVar2,iVar6,(int)local_70,local_8c);
        if (out_00->indent == 0) {
          __assert_fail("out->indent",
                        "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                        ,0x445,"void gen_trie(fb_output_t *, trie_t *, int, int, int)");
        }
        out_00->indent = out_00->indent + -1;
        println(out_00,"} /* desend suffix \"%.*s\" */",(ulong)local_bc,local_b0);
        iVar10 = iVar6 + -1;
      }
      else {
        println(out_00,"buf += 8;");
        println(out_00,"w = flatcc_json_parser_symbol_part(buf, end);");
        gen_trie(out_00,local_98,iVar6,(int)local_70,local_8c);
      }
      if (out_00->indent == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x449,"void gen_trie(fb_output_t *, trie_t *, int, int, int)");
      }
      out_00->indent = out_00->indent + -1;
      println(out_00,"} else { /* descend \"%.*s\" */",(ulong)local_bc,local_b0);
      out_00->indent = out_00->indent + 1;
    }
    bVar1 = (int)local_b8 < iVar10;
    bVar11 = iVar5 <= local_a4;
    label = 0;
    if (bVar11 && bVar1) {
      label = local_98->label + 1;
      local_98->label = label;
    }
    if ((int)local_b8 < iVar10) {
      gen_prefix_trie(out_00,local_98,(int)local_b8,iVar10 + -1,(int)local_a0,label);
    }
    if (bVar11 && bVar1) {
      println(out_00,"goto endpfguard%d;",(ulong)label);
      out_00->tmp_indent = out_00->indent;
      out_00->indent = 0;
      println(out_00,"pfguard%d:",(ulong)label);
      out_00->indent = out_00->tmp_indent;
    }
    if (local_a4 < iVar5) {
      if (iVar10 <= (int)local_b8) {
        (*local_98->gen_unmatched)(out_00);
      }
    }
    else {
      gen_trie(out_00,local_98,iVar5,local_a4,(int)local_a0);
    }
    if (bVar11 && bVar1) {
      out_00->tmp_indent = out_00->indent;
      out_00->indent = 0;
      println(out_00,"endpfguard%d:",(ulong)label);
      out_00->indent = out_00->tmp_indent;
      println(out_00,"(void)0;");
    }
    if (iVar5 <= iVar6) {
      return;
    }
    if (out_00->indent == 0) {
      __assert_fail("out->indent",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                    ,0x465,"void gen_trie(fb_output_t *, trie_t *, int, int, int)");
    }
    out_00->indent = out_00->indent + -1;
    format = "} /* descend \"%.*s\" */";
  }
  println(out_00,format,(ulong)local_bc,local_b0);
  return;
}

Assistant:

static void gen_trie(fb_output_t *out, trie_t *trie, int a, int b, int pos)
{
    int x, k;
    uint64_t tag = 0, mask = 0;
    const char *name = "";
    int len = 0, has_prefix_key = 0, prefix_guard = 0, has_descend;
    int label = 0;

    /*
     * Process a trie at the level given by pos. A single level covers
     * one tag.
     *
     * A tag is a range of 8 characters [pos..pos+7] that is read as a
     * single big endian word and tested as against a ternary trie
     * generated in code. In generated code the tag is stored in "w".
     *
     * Normally trailing data in a tag is not a problem
     * because the difference between two keys happen in the middle and
     * trailing data is not valid key material. When the difference is
     * at the end, we get a lot of special cases to handle.
     *
     * Regardless, when we believe we have a match, a final check is
     * made to ensure that the next character after the match is not a
     * valid key character - for quoted keys a valid termiantot is a
     * quote, for unquoted keys it can be one of several characters -
     * therefore quoted keys are faster to parse, even if they consume
     * more space. The trie does not care about these details, the
     * gen_match function handles this transparently for different
     * symbol types.
     */


    /*
    * If we have one or two keys that terminate in this tag, there is no
    * need to do a branch test before matching exactly.
    *
    * We observe that `gen_prefix_trie` actually handles this
    * case well, even though it was not designed for it.
    */
    if ((get_dict_suffix_len(&trie->dict[a], pos) == 0) &&
        (b == a || (b == a + 1 && get_dict_suffix_len(&trie->dict[b], pos) == 0))) {
        gen_prefix_trie(out, trie, a, b, pos, 0);
        return;
    }

    /*
     * Due trie nature, we have a left, middle, and right range where
     * the middle range all compare the same at the current trie level
     * when masked against shortest (and first) key in middle range.
     */
    x = split_dict_left(trie->dict, a, b, pos);

    if (x > a) {
        /*
         * This is normal early branch with a key `a < x < b` such that
         * any shared prefix ranges do not span x.
         */
        get_dict_tag(&trie->dict[x], pos, &tag, &mask, &name, &len);
        println(out, "if (w < 0x%"PRIx64") { /* branch \"%.*s\" */", tag, len, name); indent();
        gen_trie(out, trie, a, x - 1, pos);
        unindent(); println(out, "} else { /* branch \"%.*s\" */", len, name); indent();
        gen_trie(out, trie, x, b, pos);
        unindent(); println(out, "} /* branch \"%.*s\" */", len, name);
        return;
    }
    x = split_dict_right(trie->dict, a, b, pos);

    /*
     * [a .. x-1] is a non-empty sequence of prefixes,
     * for example { a123, a1234, a12345 }.
     * The keys might not terminate in the current tag. To find those
     * that do, we will evaluate k such that:
     * [a .. k-1] are prefixes that terminate in the current tag if any
     * such exists.
     * [x..b] are keys that are prefixes up to at least pos + 7 but
     * do not terminate in the current tag.
     * [k..x-1] are prefixes that do not termiante in the current tag.
     * Note that they might not be prefixes when considering more than the
     * current tag.
     * The range [a .. x-1] can ge generated with `gen_prefix_trie`.
     *
     * We generally have the form
     *
     * [a..b] =
     * (a)<prefixes>, (k-1)<descend-prefix>, (k)<descend>, (x)<reminder>
     *
     * Where <prefixes> are keys that terminate at the current tag.
     * <descend> are keys that have the prefixes as prefix but do not
     * terminate at the current tag.
     * <descend-prerfix> is a single key that terminates exactly
     * where the tag ends. If there are no descend keys it is part of
     * prefixes, otherwise it is tested as a special case.
     * <reminder> are any keys larger than the prefixes.
     *
     * The reminder keys cannot be tested before we are sure that no
     * prefix is matching at least no prefixes that is not a
     * descend-prefix. This is because less than comparisons are
     * affected by trailing data within the tag caused by prefixes
     * terminating early. Trailing data is not a problem if two keys are
     * longer than the point where they differ even if they terminate
     * within the current tag.
     *
     * Thus, if we have non-empty <descend> and non-empty <reminder>,
     * the reminder must guard against any matches in prefix but not
     * against any matches in <descend>. If <descend> is empty and
     * <prefixes> == <descend-prefix> a guard is also not needed.
     */

    /* Find first prefix that does not terminate at the current level, or x if absent */
    k = split_dict_descend(trie->dict, a, x - 1, pos);
    has_descend = k < x;

    /* If we have a descend, process that in isolation. */
    if (has_descend) {
        has_prefix_key = k > a && get_dict_tag_len(&trie->dict[k - 1], pos) == 8;
        get_dict_tag(&trie->dict[k], pos, &tag, &mask, &name, &len);
        println(out, "if (w == 0x%"PRIx64") { /* descend \"%.*s\" */", tag, len, name); indent();
        if (has_prefix_key) {
            /* We have a key that terminates at the descend prefix. */
            println(out, "/* descend prefix key \"%.*s\" */", len, name);
            trie->gen_match(out, trie->ct, trie->dict[k - 1].data, trie->dict[k - 1].hint, 8);
            println(out, "/* descend suffix \"%.*s\" */", len, name);
        }
        println(out, "buf += 8;");
        println(out, "w = flatcc_json_parser_symbol_part(buf, end);");
        gen_trie(out, trie, k, x - 1, pos + 8);
        if (has_prefix_key) {
            unindent(); println(out, "} /* desend suffix \"%.*s\" */", len, name);
            /* Here we move the <descend-prefix> key out of the <descend> range. */
            --k;
        }
        unindent(); println(out, "} else { /* descend \"%.*s\" */", len, name); indent();
    }
    prefix_guard = a < k && x <= b;
    if (prefix_guard) {
        label = ++trie->label;
    }
    if (a < k) {
        gen_prefix_trie(out, trie, a, k - 1, pos, label);
    }
    if (prefix_guard) {
        /* All prefixes tested, but none matched. */
        println(out, "goto endpfguard%d;", label);
        margin();
        println(out, "pfguard%d:", label);
        unmargin();
    }
    if (x <= b) {
        gen_trie(out, trie, x, b, pos);
    } else if (a >= k) {
        trie->gen_unmatched(out);
    }
    if (prefix_guard) {
        margin();
        println(out, "endpfguard%d:", label);
        unmargin();
        println(out, "(void)0;");
    }
    if (has_descend) {
        unindent(); println(out, "} /* descend \"%.*s\" */", len, name);
    }
}